

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImDrawList *this;
  GLboolean GVar3;
  GLboolean GVar4;
  GLboolean GVar5;
  GLboolean GVar6;
  undefined1 local_b8 [8];
  ImVec4 clip_rect;
  ImDrawCmd *pcmd;
  int cmd_i;
  ImDrawList *cmd_list;
  int n;
  ImVec2 clip_scale;
  ImVec2 clip_off;
  GLuint vertex_array_object;
  GLenum GStack_70;
  bool clip_origin_lower_left;
  GLboolean last_enable_scissor_test;
  GLboolean last_enable_depth_test;
  GLboolean last_enable_cull_face;
  GLboolean last_enable_blend;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  GLint last_vertex_array_object;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  int fb_height;
  int fb_width;
  ImDrawData *draw_data_local;
  
  last_active_texture = (GLenum)((draw_data->DisplaySize).x * (draw_data->FramebufferScale).x);
  last_program = (GLint)((draw_data->DisplaySize).y * (draw_data->FramebufferScale).y);
  if ((0 < (int)last_active_texture) && (0 < last_program)) {
    _fb_height = draw_data;
    (*glad_glGetIntegerv)(0x84e0,&last_texture);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glGetIntegerv)(0x8b8d,&last_sampler);
    (*glad_glGetIntegerv)(0x8069,&last_array_buffer);
    (*glad_glGetIntegerv)(0x8919,&last_vertex_array_object);
    (*glad_glGetIntegerv)(0x8894,last_polygon_mode + 1);
    (*glad_glGetIntegerv)(0x85b5,last_polygon_mode);
    (*glad_glGetIntegerv)(0xb40,last_viewport + 2);
    (*glad_glGetIntegerv)(0xba2,last_scissor_box + 2);
    (*glad_glGetIntegerv)(0xc10,(GLint *)&last_blend_dst_rgb);
    (*glad_glGetIntegerv)(0x80c9,(GLint *)&last_blend_src_alpha);
    (*glad_glGetIntegerv)(0x80c8,(GLint *)&last_blend_dst_alpha);
    (*glad_glGetIntegerv)(0x80cb,(GLint *)&last_blend_equation_rgb);
    (*glad_glGetIntegerv)(0x80ca,(GLint *)&last_blend_equation_alpha);
    (*glad_glGetIntegerv)(0x8009,(GLint *)&last_enable_scissor_test);
    (*glad_glGetIntegerv)(0x883d,(GLint *)&stack0xffffffffffffff90);
    GVar3 = (*glad_glIsEnabled)(0xbe2);
    GVar4 = (*glad_glIsEnabled)(0xb44);
    GVar5 = (*glad_glIsEnabled)(0xb71);
    GVar6 = (*glad_glIsEnabled)(0xc11);
    clip_off.y._3_1_ = 1;
    clip_off.x = 0.0;
    (*glad_glGenVertexArrays)(1,(GLuint *)&clip_off);
    ImGui_ImplOpenGL3_SetupRenderState
              (_fb_height,last_active_texture,last_program,(GLuint)clip_off.x);
    IVar1 = _fb_height->DisplayPos;
    IVar2 = _fb_height->FramebufferScale;
    for (cmd_list._0_4_ = 0; (int)cmd_list < _fb_height->CmdListsCount;
        cmd_list._0_4_ = (int)cmd_list + 1) {
      this = _fb_height->CmdLists[(int)cmd_list];
      (*glad_glBufferData)(0x8892,(long)(this->VtxBuffer).Size * 0x14,(this->VtxBuffer).Data,0x88e0)
      ;
      (*glad_glBufferData)(0x8893,(long)(this->IdxBuffer).Size << 1,(this->IdxBuffer).Data,0x88e0);
      for (pcmd._4_4_ = 0; pcmd._4_4_ < (this->CmdBuffer).Size; pcmd._4_4_ = pcmd._4_4_ + 1) {
        clip_rect._8_8_ = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,pcmd._4_4_);
        if (((ImDrawCmd *)clip_rect._8_8_)->UserCallback == (ImDrawCallback)0x0) {
          ImVec4::ImVec4((ImVec4 *)local_b8);
          clip_scale.x = IVar1.x;
          cmd_list._4_4_ = IVar2.x;
          local_b8._0_4_ = (*(float *)(clip_rect._8_8_ + 4) - clip_scale.x) * cmd_list._4_4_;
          clip_scale.y = IVar1.y;
          n = (int)IVar2.y;
          local_b8._4_4_ = (*(float *)(clip_rect._8_8_ + 8) - clip_scale.y) * (float)n;
          clip_rect.x = (*(float *)(clip_rect._8_8_ + 0xc) - clip_scale.x) * cmd_list._4_4_;
          clip_rect.y = (*(float *)(clip_rect._8_8_ + 0x10) - clip_scale.y) * (float)n;
          if (((((float)local_b8._0_4_ < (float)(int)last_active_texture) &&
               ((float)local_b8._4_4_ < (float)last_program)) && (0.0 <= clip_rect.x)) &&
             (0.0 <= clip_rect.y)) {
            if ((clip_off.y._3_1_ & 1) == 0) {
              (*glad_glScissor)((int)(float)local_b8._0_4_,(int)(float)local_b8._4_4_,
                                (int)clip_rect.x,(int)clip_rect.y);
            }
            else {
              (*glad_glScissor)((int)(float)local_b8._0_4_,(int)((float)last_program - clip_rect.y),
                                (int)(clip_rect.x - (float)local_b8._0_4_),
                                (int)(clip_rect.y - (float)local_b8._4_4_));
            }
            (*glad_glBindTexture)(0xde1,(GLuint)*(undefined8 *)(clip_rect._8_8_ + 0x18));
            (*glad_glDrawElementsBaseVertex)
                      (4,*(GLsizei *)clip_rect._8_8_,0x1403,
                       (void *)((ulong)*(uint *)(clip_rect._8_8_ + 0x24) << 1),
                       *(GLint *)(clip_rect._8_8_ + 0x20));
          }
        }
        else if (((ImDrawCmd *)clip_rect._8_8_)->UserCallback == (ImDrawCallback)0xffffffffffffffff)
        {
          ImGui_ImplOpenGL3_SetupRenderState
                    (_fb_height,last_active_texture,last_program,(GLuint)clip_off.x);
        }
        else {
          (*((ImDrawCmd *)clip_rect._8_8_)->UserCallback)(this,(ImDrawCmd *)clip_rect._8_8_);
        }
      }
    }
    (*glad_glDeleteVertexArrays)(1,(GLuint *)&clip_off);
    (*glad_glUseProgram)(last_sampler);
    (*glad_glBindTexture)(0xde1,last_array_buffer);
    (*glad_glBindSampler)(0,last_vertex_array_object);
    (*glad_glActiveTexture)(last_texture);
    (*glad_glBindVertexArray)(last_polygon_mode[0]);
    (*glad_glBindBuffer)(0x8892,last_polygon_mode[1]);
    (*glad_glBlendEquationSeparate)(_last_enable_scissor_test,GStack_70);
    (*glad_glBlendFuncSeparate)
              (last_blend_src_alpha,last_blend_dst_alpha,last_blend_equation_rgb,
               last_blend_equation_alpha);
    if (GVar3 == '\0') {
      (*glad_glDisable)(0xbe2);
    }
    else {
      (*glad_glEnable)(0xbe2);
    }
    if (GVar4 == '\0') {
      (*glad_glDisable)(0xb44);
    }
    else {
      (*glad_glEnable)(0xb44);
    }
    if (GVar5 == '\0') {
      (*glad_glDisable)(0xb71);
    }
    else {
      (*glad_glEnable)(0xb71);
    }
    if (GVar6 == '\0') {
      (*glad_glDisable)(0xc11);
    }
    else {
      (*glad_glEnable)(0xc11);
    }
    (*glad_glPolygonMode)(0x408,last_viewport[2]);
    (*glad_glViewport)(last_scissor_box[2],last_scissor_box[3],last_viewport[0],last_viewport[1]);
    (*glad_glScissor)(last_blend_dst_rgb,last_blend_src_rgb,last_scissor_box[0],last_scissor_box[1])
    ;
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
    bool clip_origin_lower_left = true;
#if defined(GL_CLIP_ORIGIN) && !defined(__APPLE__)
    GLenum last_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&last_clip_origin); // Support for GL 4.5's glClipControl(GL_UPPER_LEFT)
    if (last_clip_origin == GL_UPPER_LEFT)
        clip_origin_lower_left = false;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    if (clip_origin_lower_left)
                        glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));
                    else
                        glScissor((int)clip_rect.x, (int)clip_rect.y, (int)clip_rect.z, (int)clip_rect.w); // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#if IMGUI_IMPL_OPENGL_HAS_DRAW_WITH_BASE_VERTEX
                    glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
#else
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
#endif
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}